

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

void y4m_convert_422_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  int pli;
  int dst_c_sz;
  int dst_c_h;
  int c_sz;
  int c_h;
  int c_w;
  uchar *tmp;
  int in_stack_000000f0;
  int in_stack_000000f4;
  uchar *in_stack_000000f8;
  uchar *in_stack_00000100;
  int in_stack_00000108;
  int in_stack_0000010c;
  uchar *in_stack_00000110;
  uchar *in_stack_00000118;
  undefined4 local_38;
  
  for (local_38 = 1; local_38 < 3; local_38 = local_38 + 1) {
    y4m_42xmpeg2_42xjpeg_helper
              (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108);
    y4m_422jpeg_420jpeg_helper
              (in_stack_00000100,in_stack_000000f8,in_stack_000000f4,in_stack_000000f0);
  }
  return;
}

Assistant:

static void y4m_convert_422_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                    unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_h;
  int dst_c_sz;
  int pli;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = c_w * dst_c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*In reality, the horizontal and vertical steps could be pipelined, for
       less memory consumption and better cache performance, but we do them
       separately for simplicity.*/
    /*First do horizontal filtering (convert to 422jpeg)*/
    y4m_42xmpeg2_42xjpeg_helper(tmp, _aux, c_w, c_h);
    /*Now do the vertical filtering.*/
    y4m_422jpeg_420jpeg_helper(_dst, tmp, c_w, c_h);
    _aux += c_sz;
    _dst += dst_c_sz;
  }
}